

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_rw_hook_set(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  void *old_udata;
  fio_rw_hook_s *old_rw_hooks;
  intptr_t fd;
  void *udata_local;
  fio_rw_hook_s *rw_hooks_local;
  intptr_t uuid_local;
  
  iVar3 = fio_is_closed(uuid);
  if (iVar3 == 0) {
    if (rw_hooks->read == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
      rw_hooks->read = fio_hooks_default_read;
    }
    if (rw_hooks->write == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
      rw_hooks->write = fio_hooks_default_write;
    }
    if (rw_hooks->flush == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
      rw_hooks->flush = fio_hooks_default_flush;
    }
    if (rw_hooks->before_close == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
      rw_hooks->before_close = fio_hooks_default_before_close;
    }
    if (rw_hooks->cleanup == (_func_void_void_ptr *)0x0) {
      rw_hooks->cleanup = fio_hooks_default_cleanup;
    }
    iVar3 = (int)((ulong)uuid >> 8);
    lVar4 = (long)iVar3;
    fio_lock((fio_lock_i *)((long)fio_data + lVar4 * 0xa8 + 0x6e));
    if (CONCAT41(iVar3,*(undefined1 *)((long)fio_data + lVar4 * 0xa8 + 0x6d)) == uuid) {
      lVar1 = *(long *)((long)fio_data + lVar4 * 0xa8 + 0xa8);
      uVar2 = *(undefined8 *)((long)fio_data + lVar4 * 0xa8 + 0xb0);
      *(fio_rw_hook_s **)((long)fio_data + lVar4 * 0xa8 + 0xa8) = rw_hooks;
      *(void **)((long)fio_data + lVar4 * 0xa8 + 0xb0) = udata;
      fio_unlock((fio_lock_i *)((long)fio_data + lVar4 * 0xa8 + 0x6e));
      if ((lVar1 != 0) && (*(long *)(lVar1 + 0x20) != 0)) {
        (**(code **)(lVar1 + 0x20))(uVar2);
      }
      return 0;
    }
    fio_unlock((fio_lock_i *)((long)fio_data + lVar4 * 0xa8 + 0x6e));
  }
  if (rw_hooks->cleanup == (_func_void_void_ptr *)0x0) {
    (*rw_hooks->cleanup)(udata);
  }
  return -1;
}

Assistant:

int fio_rw_hook_set(intptr_t uuid, fio_rw_hook_s *rw_hooks, void *udata) {
  if (fio_is_closed(uuid))
    goto invalid_uuid;
  if (!rw_hooks->read)
    rw_hooks->read = fio_hooks_default_read;
  if (!rw_hooks->write)
    rw_hooks->write = fio_hooks_default_write;
  if (!rw_hooks->flush)
    rw_hooks->flush = fio_hooks_default_flush;
  if (!rw_hooks->before_close)
    rw_hooks->before_close = fio_hooks_default_before_close;
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  intptr_t fd = fio_uuid2fd(uuid);
  fio_rw_hook_s *old_rw_hooks;
  void *old_udata;
  fio_lock(&fd_data(fd).sock_lock);
  if (fd2uuid(fd) != uuid) {
    fio_unlock(&fd_data(fd).sock_lock);
    goto invalid_uuid;
  }
  old_rw_hooks = fd_data(fd).rw_hooks;
  old_udata = fd_data(fd).rw_udata;
  fd_data(fd).rw_hooks = rw_hooks;
  fd_data(fd).rw_udata = udata;
  fio_unlock(&fd_data(fd).sock_lock);
  if (old_rw_hooks && old_rw_hooks->cleanup)
    old_rw_hooks->cleanup(old_udata);
  return 0;
invalid_uuid:
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup(udata);
  return -1;
}